

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_mels.c
# Opt level: O0

int check_retval(void *returnvalue,char *funcname,int opt)

{
  int in_EDX;
  undefined8 in_RSI;
  uint *in_RDI;
  int *retval;
  int local_4;
  
  if ((in_EDX == 0) && (in_RDI == (uint *)0x0)) {
    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",in_RSI);
    local_4 = 1;
  }
  else {
    if (in_EDX == 1) {
      if ((int)*in_RDI < 0) {
        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",in_RSI,(ulong)*in_RDI);
        return 1;
      }
    }
    else if ((in_EDX == 2) && (in_RDI == (uint *)0x0)) {
      fprintf(_stderr,"\nMEMORY_ERROR: %s() failed - returned NULL pointer\n\n",in_RSI);
      return 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int check_retval(void* returnvalue, const char* funcname, int opt)
{
  int* retval;

  /* Check if SUNDIALS function returned NULL pointer - no memory allocated */
  if (opt == 0 && returnvalue == NULL)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  /* Check if flag < 0 */
  else if (opt == 1)
  {
    retval = (int*)returnvalue;
    if (*retval < 0)
    {
      fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
              funcname, *retval);
      return 1;
    }
  }

  /* Check if function returned NULL pointer - no memory allocated */
  else if (opt == 2 && returnvalue == NULL)
  {
    fprintf(stderr, "\nMEMORY_ERROR: %s() failed - returned NULL pointer\n\n",
            funcname);
    return 1;
  }

  return 0;
}